

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O1

string * __thiscall libcellml::Entity::id_abi_cxx11_(string *__return_storage_ptr__,Entity *this)

{
  EntityImpl *pEVar1;
  pointer pcVar2;
  
  pEVar1 = this->mPimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pEVar1->mId)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pEVar1->mId)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Entity::id() const
{
    return pFunc()->mId;
}